

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O0

void __thiscall TCLAP::StdOutput::version(StdOutput *this,CmdLineInterface *_cmd)

{
  string *psVar1;
  ostream *poVar2;
  void *this_00;
  long *in_RSI;
  string xversion;
  string progName;
  string local_50 [32];
  string local_30 [32];
  long *local_10;
  
  local_10 = in_RSI;
  psVar1 = (string *)(**(code **)(*in_RSI + 0x50))();
  std::__cxx11::string::string(local_30,psVar1);
  psVar1 = (string *)(**(code **)(*local_10 + 0x48))();
  std::__cxx11::string::string(local_50,psVar1);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,local_30);
  poVar2 = std::operator<<(poVar2,"  version: ");
  poVar2 = std::operator<<(poVar2,local_50);
  this_00 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

inline void StdOutput::version(CmdLineInterface& _cmd) 
{
	std::string progName = _cmd.getProgramName();
	std::string xversion = _cmd.getVersion();

	std::cout << std::endl << progName << "  version: " 
			  << xversion << std::endl << std::endl;
}